

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O2

QJsonValue * __thiscall
QJsonArray::at(QJsonValue *__return_storage_ptr__,QJsonArray *this,qsizetype i)

{
  QCborContainerPrivate *this_00;
  long in_FS_OFFSET;
  QCborValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->a).d.ptr;
  if ((i < 0 || this_00 == (QCborContainerPrivate *)0x0) ||
     ((ulong)(this_00->elements).d.size <= (ulong)i)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QJsonValue::QJsonValue(__return_storage_ptr__,Undefined);
      return __return_storage_ptr__;
    }
  }
  else {
    QCborContainerPrivate::valueAt(&local_30,this_00,i);
    QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,&local_30);
    QCborValue::~QCborValue((QCborValue *)&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonArray::at(qsizetype i) const
{
    if (!a || i < 0 || i >= a->elements.size())
        return QJsonValue(QJsonValue::Undefined);

    return QJsonPrivate::Value::fromTrustedCbor(a->valueAt(i));
}